

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall duckdb_snappy::SnappyDecompressor::RefillTag(SnappyDecompressor *this)

{
  int iVar1;
  uint32_t uVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  size_t n;
  ulong local_38;
  uint8_t *__src;
  
  __src = (uint8_t *)this->ip_;
  local_38 = in_RAX;
  if (__src == (uint8_t *)this->ip_limit_) {
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    iVar1 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
    __src = (uint8_t *)CONCAT44(extraout_var,iVar1);
    this->peeked_ = (uint32_t)local_38;
    this->eof_ = local_38 == 0;
    if (local_38 == 0) {
      return false;
    }
    this->ip_limit_ = (char *)(__src + local_38);
  }
  uVar2 = CalculateNeeded(*__src);
  uVar6 = (long)this->ip_limit_ - (long)__src;
  uVar4 = (uint)uVar6;
  if (uVar4 < uVar2) {
    pcVar3 = this->scratch_;
    memmove(pcVar3,__src,uVar6 & 0xffffffff);
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    while( true ) {
      uVar5 = (uint)uVar6;
      uVar4 = uVar2 - uVar5;
      if (uVar2 < uVar5 || uVar4 == 0) break;
      iVar1 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
      if (local_38 == 0) {
        return false;
      }
      __n = local_38 & 0xffffffff;
      if (uVar4 < (uint)local_38) {
        __n = (size_t)uVar4;
      }
      switchD_016b45db::default
                (pcVar3 + (uVar6 & 0xffffffff),(void *)CONCAT44(extraout_var_00,iVar1),__n);
      uVar6 = (ulong)(uVar5 + (int)__n);
      (*this->reader_->_vptr_Source[4])(this->reader_,__n);
    }
    this->ip_ = pcVar3;
    pcVar3 = pcVar3 + uVar2;
  }
  else {
    if (4 < uVar4) {
      this->ip_ = (char *)__src;
      return true;
    }
    memmove(this->scratch_,__src,(ulong)(uVar4 & 7));
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    this->ip_ = this->scratch_;
    pcVar3 = this->scratch_ + (uVar4 & 7);
  }
  this->ip_limit_ = pcVar3;
  return true;
}

Assistant:

bool SnappyDecompressor::RefillTag() {
  const char* ip = ip_;
  if (ip == ip_limit_) {
    // Fetch a new fragment from the reader
    reader_->Skip(peeked_);  // All peeked bytes are used up
    size_t n;
    ip = reader_->Peek(&n);
    peeked_ = n;
    eof_ = (n == 0);
    if (eof_) return false;
    ip_limit_ = ip + n;
  }

  // Read the tag character
  assert(ip < ip_limit_);
  const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
  // At this point make sure that the data for the next tag is consecutive.
  // For copy 1 this means the next 2 bytes (tag and 1 byte offset)
  // For copy 2 the next 3 bytes (tag and 2 byte offset)
  // For copy 4 the next 5 bytes (tag and 4 byte offset)
  // For all small literals we only need 1 byte buf for literals 60...63 the
  // length is encoded in 1...4 extra bytes.
  const uint32_t needed = CalculateNeeded(c);
  assert(needed <= sizeof(scratch_));

  // Read more bytes from reader if needed
  uint32_t nbuf = ip_limit_ - ip;
  if (nbuf < needed) {
    // Stitch together bytes from ip and reader to form the word
    // contents.  We store the needed bytes in "scratch_".  They
    // will be consumed immediately by the caller since we do not
    // read more than we need.
    std::memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    while (nbuf < needed) {
      size_t length;
      const char* src = reader_->Peek(&length);
      if (length == 0) return false;
      uint32_t to_add = std::min<uint32_t>(needed - nbuf, length);
      std::memcpy(scratch_ + nbuf, src, to_add);
      nbuf += to_add;
      reader_->Skip(to_add);
    }
    assert(nbuf == needed);
    ip_ = scratch_;
    ip_limit_ = scratch_ + needed;
  } else if (nbuf < kMaximumTagLength) {
    // Have enough bytes, but move into scratch_ so that we do not
    // read past end of input
    std::memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    ip_ = scratch_;
    ip_limit_ = scratch_ + nbuf;
  } else {
    // Pass pointer to buffer returned by reader_.
    ip_ = ip;
  }
  return true;
}